

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t sse4_despace_skinny_u2(char *bytes,size_t howmany)

{
  long lVar1;
  int *in_RDX;
  size_t sVar2;
  longlong lVar3;
  undefined8 uVar4;
  longlong lVar5;
  __m128i x_00;
  __m128i x_01;
  __m128i alVar6;
  undefined4 local_fc;
  char c;
  undefined8 uStack_f8;
  int mask16_1;
  __m128i x;
  undefined4 local_dc;
  undefined8 uStack_d8;
  int mask16;
  __m128i x2;
  __m128i x1;
  ulong local_b0;
  size_t i;
  size_t pos;
  size_t howmany_local;
  char *bytes_local;
  
  i = 0;
  sVar2 = howmany;
  for (local_b0 = 0; local_b0 + 0x1f < howmany; local_b0 = local_b0 + 0x20) {
    lVar3 = *(longlong *)(bytes + local_b0);
    lVar5 = *(longlong *)((long)(bytes + local_b0) + 8);
    uStack_d8 = *(undefined8 *)(bytes + local_b0 + 0x10);
    x2[0] = *(longlong *)(bytes + local_b0 + 0x18);
    alVar6[1] = sVar2;
    alVar6[0] = (longlong)&local_dc;
    x2[1] = lVar3;
    alVar6 = skinnycleanm128(alVar6,in_RDX);
    *(longlong *)(bytes + i) = lVar3;
    *(longlong *)((long)(bytes + i) + 8) = lVar5;
    lVar1 = (long)(0x10 - POPCOUNT(local_dc)) + i;
    x_00[1] = sVar2;
    x_00[0] = (longlong)&local_dc;
    x2[1] = lVar3;
    alVar6 = skinnycleanm128(x_00,alVar6[1]);
    in_RDX = alVar6[1];
    *(undefined8 *)(bytes + lVar1) = uStack_d8;
    *(longlong *)(bytes + lVar1 + 8) = x2[0];
    i = (0x10 - POPCOUNT(local_dc)) + lVar1;
  }
  for (; local_b0 + 0xf < howmany; local_b0 = local_b0 + 0x10) {
    uVar4 = *(undefined8 *)(bytes + local_b0);
    lVar3 = *(longlong *)(bytes + local_b0 + 8);
    x_01[1] = sVar2;
    x_01[0] = (longlong)&local_fc;
    uStack_f8 = uVar4;
    x[0] = lVar3;
    alVar6 = skinnycleanm128(x_01,in_RDX);
    in_RDX = alVar6[1];
    *(undefined8 *)(bytes + i) = uVar4;
    *(longlong *)(bytes + i + 8) = lVar3;
    i = (long)(0x10 - POPCOUNT(local_fc)) + i;
  }
  for (; local_b0 < howmany; local_b0 = local_b0 + 1) {
    if (' ' < bytes[local_b0]) {
      bytes[i] = bytes[local_b0];
      i = i + 1;
    }
  }
  return i;
}

Assistant:

size_t sse4_despace_skinny_u2(char *bytes, size_t howmany) {
  size_t pos = 0;
  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m128i x1 = _mm_loadu_si128((const __m128i *)(bytes + i));
    __m128i x2 = _mm_loadu_si128((const __m128i *)(bytes + i + 16));

    int mask16;
    x1 = skinnycleanm128(x1, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x1);
    pos += 16 - _mm_popcnt_u32(mask16);

    x2 = skinnycleanm128(x2, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x2);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = skinnycleanm128(x, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if( (int) c <= 0x20) {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}